

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WuQuantizer.cpp
# Opt level: O2

HaU32 HACD::kmeans_cluster<HACD::Vec3d<float>,float>
                (Vec3d<float> *input,HaU32 inputCount,HaU32 clumpCount,Vec3d<float> *clusters,
                HaU32 *outputIndices,float threshold,float collapseDistance)

{
  ulong uVar1;
  int *__ptr;
  void *__ptr_00;
  int *piVar2;
  ulong uVar3;
  HaU32 j;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  HaU32 i;
  size_t __size;
  ulong uVar8;
  Vec3d<float> *this;
  ulong uVar9;
  Vec3d<float> *pVVar10;
  size_t sVar11;
  ulong uVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  undefined1 in_XMM2 [16];
  float local_7c;
  float local_60;
  
  uVar9 = (ulong)clumpCount;
  uVar1 = (ulong)inputCount;
  __ptr = (int *)malloc(uVar9 * 4);
  if (clumpCount < inputCount) {
    __size = uVar9 * 0xc;
    __ptr_00 = malloc(__size);
    uVar8 = 0;
    for (lVar7 = 0; __size - lVar7 != 0; lVar7 = lVar7 + 0xc) {
      uVar5 = uVar8 / clumpCount;
      if (inputCount <= (uint)uVar5) {
        __assert_fail("index >= 0 && index < inputCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                      ,0x2a5,
                      "hacd::HaU32 HACD::kmeans_cluster(const Vec *, hacd::HaU32, hacd::HaU32, Vec *, hacd::HaU32 *, Type, Type) [Vec = HACD::Vec3d<float>, Type = float]"
                     );
      }
      uVar8 = (ulong)((int)uVar8 + inputCount);
      *(float *)((long)&clusters->z + lVar7) = input[uVar5].z;
      *(undefined8 *)((long)&clusters->x + lVar7) = *(undefined8 *)(input + uVar5);
    }
    iVar6 = 0x40;
    local_60 = 3.4028235e+38;
    do {
      piVar2 = __ptr;
      for (lVar7 = 0; uVar9 * 3 != lVar7; lVar7 = lVar7 + 3) {
        *piVar2 = 0;
        *(undefined8 *)((long)__ptr_00 + lVar7 * 4) = 0;
        *(undefined4 *)((long)__ptr_00 + lVar7 * 4 + 8) = 0;
        piVar2 = piVar2 + 1;
      }
      fVar16 = 0.0;
      for (uVar8 = 0; uVar8 != uVar1; uVar8 = uVar8 + 1) {
        local_7c = 3.4028235e+38;
        pVVar10 = clusters;
        for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
          fVar15 = Vec3d<float>::distanceSquared(input + uVar8,pVVar10);
          if (fVar15 < local_7c) {
            outputIndices[uVar8] = (HaU32)uVar5;
            local_7c = fVar15;
          }
          pVVar10 = pVVar10 + 1;
        }
        uVar4 = outputIndices[uVar8];
        Vec3d<float>::operator+=
                  ((Vec3d<float> *)((ulong)uVar4 * 0xc + (long)__ptr_00),input + uVar8);
        fVar16 = fVar16 + local_7c;
        __ptr[uVar4] = __ptr[uVar4] + 1;
      }
      piVar2 = __ptr;
      for (sVar11 = 0; __size != sVar11; sVar11 = sVar11 + 0xc) {
        if (*piVar2 != 0) {
          auVar14 = vcvtusi2ss_avx512f(in_XMM2,*piVar2);
          Vec3d<float>::operator*=((Vec3d<float> *)((long)__ptr_00 + sVar11),1.0 / auVar14._0_4_);
          *(undefined4 *)((long)&clusters->z + sVar11) =
               *(undefined4 *)((long)__ptr_00 + sVar11 + 8);
          *(undefined8 *)((long)&clusters->x + sVar11) = *(undefined8 *)((long)__ptr_00 + sVar11);
        }
        piVar2 = piVar2 + 1;
      }
      iVar6 = iVar6 + -1;
    } while (((iVar6 != 0) && (threshold <= fVar16)) &&
            (auVar14._8_4_ = 0x7fffffff, auVar14._0_8_ = 0x7fffffff7fffffff,
            auVar14._12_4_ = 0x7fffffff,
            auVar14 = vandps_avx512vl(ZEXT416((uint)(fVar16 - local_60)),auVar14), local_60 = fVar16
            , threshold < auVar14._0_4_));
    free(__ptr_00);
  }
  else {
    lVar7 = 0;
    for (uVar8 = 0; uVar9 = uVar1, uVar1 != uVar8; uVar8 = uVar8 + 1) {
      if (outputIndices != (HaU32 *)0x0) {
        outputIndices[uVar8] = (HaU32)uVar8;
      }
      *(undefined4 *)((long)&clusters->z + lVar7) = *(undefined4 *)((long)&input->z + lVar7);
      *(undefined8 *)((long)&clusters->x + lVar7) = *(undefined8 *)((long)&input->x + lVar7);
      __ptr[uVar8] = 1;
      lVar7 = lVar7 + 0xc;
    }
  }
  uVar8 = 0;
  uVar4 = 0;
  do {
    if (uVar8 == uVar9) {
      free(__ptr);
      return uVar4;
    }
    if (__ptr[uVar8] != 0) {
      uVar12 = (ulong)uVar4;
      this = clusters + uVar8;
      pVVar10 = clusters;
      for (uVar5 = 0; uVar12 != uVar5; uVar5 = uVar5 + 1) {
        fVar16 = Vec3d<float>::distanceSquared(this,pVVar10);
        if (fVar16 < collapseDistance * collapseDistance) {
          bVar13 = uVar5 < uVar12;
          goto LAB_00d95e0a;
        }
        pVVar10 = pVVar10 + 1;
      }
      bVar13 = false;
      uVar5 = uVar12;
LAB_00d95e0a:
      if ((outputIndices != (HaU32 *)0x0) && (uVar8 != uVar12 || bVar13)) {
        for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
          if (uVar8 == outputIndices[uVar3]) {
            outputIndices[uVar3] = (HaU32)uVar5;
          }
        }
      }
      if (!bVar13) {
        clusters[uVar12].z = this->z;
        uVar4 = uVar4 + 1;
        fVar16 = this->y;
        clusters[uVar12].x = this->x;
        clusters[uVar12].y = fVar16;
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

hacd::HaU32	kmeans_cluster(const Vec *input,
						   hacd::HaU32 inputCount,
						   hacd::HaU32 clumpCount,
						   Vec *clusters,
						   hacd::HaU32 *outputIndices,
						   Type threshold, // controls how long it works to converge towards a least errors solution.
						   Type collapseDistance) // distance between clumps to consider them to be essentially equal.
{
	hacd::HaU32 convergeCount = 64; // maximum number of iterations attempting to converge to a solution..
	hacd::HaU32 *counts = (hacd::HaU32 *)HACD_ALLOC(sizeof(hacd::HaU32)*clumpCount);
	Type error=0;
	if ( inputCount <= clumpCount ) // if the number of input points is less than our clumping size, just return the input points.
	{
		clumpCount = inputCount;
		for (hacd::HaU32 i=0; i<inputCount; i++)
		{
			if ( outputIndices )
			{
				outputIndices[i] = i;
			}
			clusters[i] = input[i];
			counts[i] = 1;
		}
	}
	else
	{
		Vec *centroids = (Vec *)HACD_ALLOC(sizeof(Vec)*clumpCount);

		// Take a sampling of the input points as initial centroid estimates.
		for (hacd::HaU32 i=0; i<clumpCount; i++)
		{
			hacd::HaU32 index = (i*inputCount)/clumpCount;
			assert( index >= 0 && index < inputCount );
			clusters[i] = input[index];
		}

		// Here is the main convergence loop
		Type old_error = FLT_MAX;	// old and initial error estimates are max Type
		error = FLT_MAX;
		do
		{
			old_error = error;	// preserve the old error
			// reset the counts and centroids to current cluster location
			for (hacd::HaU32 i=0; i<clumpCount; i++)
			{
				counts[i] = 0;
				centroids[i].zero();
			}
			error = 0;
			// For each input data point, figure out which cluster it is closest too and add it to that cluster.
			for (hacd::HaU32 i=0; i<inputCount; i++)
			{
				Type min_distance = FLT_MAX;
				// find the nearest clump to this point.
				for (hacd::HaU32 j=0; j<clumpCount; j++)
				{
					Type distance = input[i].distanceSquared( clusters[j] );
					if ( distance < min_distance )
					{
						min_distance = distance;
						outputIndices[i] = j; // save which clump this point indexes
					}
				}
				hacd::HaU32 index = outputIndices[i]; // which clump was nearest to this point.
				centroids[index]+=input[i];
				counts[index]++;	// increment the counter indicating how many points are in this clump.
				error+=min_distance; // save the error accumulation
			}
			// Now, for each clump, compute the mean and store the result.
			for (hacd::HaU32 i=0; i<clumpCount; i++)
			{
				if ( counts[i] ) // if this clump got any points added to it...
				{
					Type recip = 1.0f / (Type)counts[i];	// compute the average (center of those points)
					centroids[i]*=recip;	// compute the average center of the points in this clump.
					clusters[i] = centroids[i]; // store it as the new cluster.
				}
			}
			// decrement the convergence counter and bail if it is taking too long to converge to a solution.
			convergeCount--;
			if (convergeCount == 0 )
			{
				break;
			}
			if ( error < threshold ) // early exit if our first guess is already good enough (if all input points are the same)
				break;
		} while ( fabs(error - old_error) > threshold ); // keep going until the error is reduced by this threshold amount.

		HACD_FREE(centroids);
	}

	// ok..now we prune the clumps if necessary.
	// The rules are; first, if a clump has no 'counts' then we prune it as it's unused.
	// The second, is if the centroid of this clump is essentially  the same (based on the distance tolerance)
	// as an existing clump, then it is pruned and all indices which used to point to it, now point to the one
	// it is closest too.
	hacd::HaU32 outCount = 0; // number of clumps output after pruning performed.
	Type d2 = collapseDistance*collapseDistance; // squared collapse distance.
	for (hacd::HaU32 i=0; i<clumpCount; i++)
	{
		if ( counts[i] == 0 ) // if no points ended up in this clump, eliminate it.
			continue;
		// see if this clump is too close to any already accepted clump.
		bool add = true;
		hacd::HaU32 remapIndex = outCount; // by default this clump will be remapped to its current index.
		for (hacd::HaU32 j=0; j<outCount; j++)
		{
			Type distance = clusters[i].distanceSquared(clusters[j]);
			if ( distance < d2 )
			{
				remapIndex = j;
				add = false; // we do not add this clump
				break;
			}
		}
		// If we have fewer output clumps than input clumps so far, then we need to remap the old indices to the new ones.
		if ( outputIndices )
		{
			if ( outCount != i || !add ) // we need to remap indices!  everything that was index 'i' now needs to be remapped to 'outCount'
			{
				for (hacd::HaU32 j=0; j<inputCount; j++)
				{
					if ( outputIndices[j] == i )
					{
						outputIndices[j] = remapIndex; //
					}
				}
			}
		}
		if ( add )
		{
			clusters[outCount] = clusters[i];
			outCount++;
		}
	}
	HACD_FREE(counts);
	clumpCount = outCount;
	return clumpCount;
}